

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtexthtmlparser.cpp
# Opt level: O0

void __thiscall QTextHtmlParser::parseCloseTag(QTextHtmlParser *this)

{
  long lVar1;
  bool bVar2;
  QChar QVar3;
  QTextHtmlParserNode *pQVar4;
  ulong uVar5;
  reference ppQVar6;
  QTextHtmlParser *in_RDI;
  long in_FS_OFFSET;
  int p;
  QChar c;
  QString tag;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  QTextHtmlParser *in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  int local_64;
  QChar local_56;
  QChar QVar7;
  int in_stack_ffffffffffffffac;
  QTextHtmlParser *in_stack_ffffffffffffffb0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  in_RDI->pos = in_RDI->pos + 1;
  parseWord(in_RDI);
  QString::toLower((QString *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  QString::trimmed((QString *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  QString::~QString((QString *)0x85ad1a);
  QString::~QString((QString *)0x85ad24);
  do {
    if (in_RDI->len <= in_RDI->pos) break;
    QVar7.ucs = (char16_t)in_stack_ffffffffffffffac;
    in_RDI->pos = in_RDI->pos + 1;
    QVar3 = QString::at((QString *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),
                        (qsizetype)in_stack_ffffffffffffff80);
    in_stack_ffffffffffffffac = CONCAT22(QVar3.ucs,QVar7.ucs);
    QChar::QChar<char16_t,_true>((QChar *)&stack0xffffffffffffffac,L'>');
    bVar2 = ::operator==((QChar *)in_stack_ffffffffffffff80,
                         (QChar *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  } while (!bVar2);
  local_64 = last((QTextHtmlParser *)0x85ad93);
  if (0 < local_64) {
    at(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    bVar2 = ::operator==((QString *)in_stack_ffffffffffffff80,
                         (QString *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    if (bVar2) {
      pQVar4 = at(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
      bVar2 = QTextHtmlParserNode::mayNotHaveChildren(pQVar4);
      if (bVar2) {
        local_64 = local_64 + -1;
      }
    }
  }
  while( true ) {
    bVar2 = false;
    if (local_64 != 0) {
      at(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
      bVar2 = ::operator!=((QString *)in_stack_ffffffffffffff80,
                           (QString *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78))
      ;
    }
    if (bVar2 == false) break;
    pQVar4 = at(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    local_64 = pQVar4->parent;
  }
  if (local_64 != 0) {
    pQVar4 = at(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    if (((pQVar4->wsm == WhiteSpacePre) ||
        (pQVar4 = at(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c),
        pQVar4->wsm == WhiteSpacePreWrap)) ||
       (pQVar4 = at(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c),
       pQVar4->wsm == WhiteSpacePreLine)) {
      pQVar4 = at(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
      bVar2 = QTextHtmlParserNode::isBlock(pQVar4);
      if (bVar2) {
        last((QTextHtmlParser *)0x85aebe);
        pQVar4 = at(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
        in_stack_ffffffffffffff80 = (QTextHtmlParser *)&pQVar4->text;
        QChar::QChar<char16_t,_true>(&local_56,L'\n');
        uVar5 = QString::endsWith((QChar)(char16_t)in_stack_ffffffffffffff80,
                                  (uint)(ushort)local_56.ucs);
        if ((uVar5 & 1) != 0) {
          last((QTextHtmlParser *)0x85af06);
          ppQVar6 = QList<QTextHtmlParserNode_*>::operator[]
                              (&in_stack_ffffffffffffff80->nodes,
                               CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
          QString::chop((longlong)&(*ppQVar6)->text);
        }
      }
    }
    at(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    newNode(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    resolveNode(in_RDI);
  }
  QString::~QString((QString *)0x85af5d);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextHtmlParser::parseCloseTag()
{
    ++pos;
    QString tag = parseWord().toLower().trimmed();
    while (pos < len) {
        QChar c = txt.at(pos++);
        if (c == u'>')
            break;
    }

    // find corresponding open node
    int p = last();
    if (p > 0
        && at(p - 1).tag == tag
        && at(p - 1).mayNotHaveChildren())
        p--;

    while (p && at(p).tag != tag)
        p = at(p).parent;

    // simply ignore the tag if we can't find
    // a corresponding open node, for broken
    // html such as <font>blah</font></font>
    if (!p)
        return;

    // in a white-space preserving environment strip off a trailing newline
    // since the closing of the opening block element will automatically result
    // in a new block for elements following the <pre>
    // ...foo\n</pre><p>blah -> foo</pre><p>blah
    if ((at(p).wsm == QTextHtmlParserNode::WhiteSpacePre
         || at(p).wsm == QTextHtmlParserNode::WhiteSpacePreWrap
         || at(p).wsm == QTextHtmlParserNode::WhiteSpacePreLine)
        && at(p).isBlock()) {
        if (at(last()).text.endsWith(u'\n'))
            nodes[last()]->text.chop(1);
    }

    newNode(at(p).parent);
    resolveNode();
}